

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O2

int32 mkvmuxer::SerializeInt(IMkvWriter *writer,int64 value,int32 size)

{
  int iVar1;
  undefined8 in_RAX;
  int iVar2;
  ulong uVar3;
  undefined7 uStack_38;
  uint8 b;
  
  if (size - 9U < 0xfffffff8 || writer == (IMkvWriter *)0x0) {
    iVar1 = -1;
  }
  else {
    uVar3 = (ulong)(size + 1);
    iVar2 = size * 8;
    _uStack_38 = in_RAX;
    do {
      iVar2 = iVar2 + -8;
      uVar3 = uVar3 - 1;
      if (uVar3 == 0) {
        return 0;
      }
      _uStack_38 = CONCAT17((char)(value >> ((byte)iVar2 & 0x3f)),uStack_38);
      iVar1 = (**writer->_vptr_IMkvWriter)(writer,&b,1);
    } while (-1 < iVar1);
  }
  return iVar1;
}

Assistant:

int32 SerializeInt(IMkvWriter* writer, int64 value, int32 size) {
  if (!writer || size < 1 || size > 8)
    return -1;

  for (int32 i = 1; i <= size; ++i) {
    const int32 byte_count = size - i;
    const int32 bit_count = byte_count * 8;

    const int64 bb = value >> bit_count;
    const uint8 b = static_cast<uint8>(bb);

    const int32 status = writer->Write(&b, 1);

    if (status < 0)
      return status;
  }

  return 0;
}